

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

int __thiscall
helics::CoreBroker::connect(CoreBroker *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  BrokerBase *this_00;
  long lVar1;
  pointer pcVar2;
  size_type sVar3;
  string_view message;
  string_view message_00;
  bool bVar4;
  int iVar5;
  string *psVar6;
  undefined8 unaff_RBP;
  undefined7 uVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view name;
  string_view string1;
  string_view string1_00;
  format_args args;
  string_view name_00;
  string_view string2;
  string_view name_01;
  string local_108;
  ActionMessage reg;
  
  uVar7 = (undefined7)((ulong)unaff_RBP >> 8);
  if ((this->super_BrokerBase).brokerState._M_i < CONNECTED) {
    this_00 = &this->super_BrokerBase;
    bVar4 = BrokerBase::transitionBrokerState(this_00,CONFIGURED,CONNECTING);
    if (bVar4) {
      if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        in_R9.values_ = (value<fmt::v11::context> *)0x0;
        message._M_str = "connecting";
        message._M_len = 10;
        name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,9,name_00,message,false);
      }
      lVar1 = (this->super_BrokerBase).timeout.internalTimeCode;
      (((this->timeoutMon)._M_t.
        super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>.
        _M_t.
        super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
        .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl)->timeout).__r =
           (long)((double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      iVar5 = (*(this->super_Broker)._vptr_Broker[0x20])(this);
      if ((char)iVar5 == '\0') {
        BrokerBase::setBrokerState(this_00,CONFIGURED);
        return 0;
      }
      gmlc::concurrency::TriggerVariable::activate(&this->disconnection);
      BrokerBase::setBrokerState(this_00,CONNECTED);
      ActionMessage::ActionMessage(&reg,cmd_broker_setup);
      BrokerBase::addActionMessage(this_00,&reg);
      ActionMessage::~ActionMessage(&reg);
      if (((this->super_BrokerBase).field_0x293 & 1) == 0) {
        ActionMessage::ActionMessage(&reg,cmd_reg_broker);
        reg.source_id.gid = -2010000000;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        ActionMessage::name(&reg,name);
        if ((this->super_BrokerBase).no_ping == true) {
          reg._24_8_ = reg._24_8_ | 0x40000000;
        }
        if ((this->super_BrokerBase).useJsonSerialization == true) {
          reg._24_8_ = reg._24_8_ | 0x400000;
        }
        if (((this->super_BrokerBase).brokerKey._M_string_length == 0) ||
           (bVar4 = std::operator==(&(this->super_BrokerBase).brokerKey,"**"), bVar4)) {
          psVar6 = getAddress_abi_cxx11_(this);
          string1._M_str = (psVar6->_M_dataplus)._M_p;
          string1._M_len = psVar6->_M_string_length;
          ActionMessage::setStringData(&reg,string1);
        }
        else {
          psVar6 = getAddress_abi_cxx11_(this);
          string1_00._M_str = (psVar6->_M_dataplus)._M_p;
          string1_00._M_len = psVar6->_M_string_length;
          string2._M_str = (this->super_BrokerBase).brokerKey._M_dataplus._M_p;
          string2._M_len = (this->super_BrokerBase).brokerKey._M_string_length;
          ActionMessage::setStringData(&reg,string1_00,string2);
        }
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&reg);
        ActionMessage::~ActionMessage(&reg);
      }
      if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar3 = (this->super_BrokerBase).identifier._M_string_length;
        psVar6 = getAddress_abi_cxx11_(this);
        reg._0_8_ = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        reg._8_8_ = (this->super_BrokerBase).identifier._M_string_length;
        reg._16_8_ = (psVar6->_M_dataplus)._M_p;
        reg._24_8_ = psVar6->_M_string_length;
        fmt.size_ = 0xdd;
        fmt.data_ = (char *)0x19;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&reg;
        ::fmt::v11::vformat_abi_cxx11_(&local_108,(v11 *)"Broker {} connected on {}",fmt,args);
        message_00._M_str = local_108._M_dataplus._M_p;
        message_00._M_len = local_108._M_string_length;
        name_01._M_str = pcVar2;
        name_01._M_len = sVar3;
        BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,6,name_01,message_00,false);
        std::__cxx11::string::~string((string *)&local_108);
      }
      iVar5 = (int)CONCAT71(uVar7,1);
      if ((this->super_BrokerBase).configString._M_string_length == 0) {
        return iVar5;
      }
      makeConnections(this,&(this->super_BrokerBase).configString);
      return iVar5;
    }
    if ((this->super_BrokerBase).brokerState._M_i == CONNECTING) {
      while ((this->super_BrokerBase).brokerState._M_i == CONNECTING) {
        reg.messageAction = cmd_exec_request;
        reg.messageID = 0;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&reg);
      }
    }
  }
  return (int)CONCAT71(uVar7,(ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) <
                             7);
}

Assistant:

bool CoreBroker::connect()
{
    if (getBrokerState() < BrokerState::CONNECTED) {
        if (transitionBrokerState(BrokerState::CONFIGURED, BrokerState::CONNECTING)) {
            LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "connecting");
            timeoutMon->setTimeout(std::chrono::milliseconds(timeout));
            auto res = brokerConnect();
            if (res) {
                disconnection.activate();
                setBrokerState(BrokerState::CONNECTED);
                addActionMessage(CMD_BROKER_SETUP);
                if (!_isRoot) {
                    ActionMessage reg(CMD_REG_BROKER);
                    reg.source_id = GlobalFederateId{};
                    reg.name(getIdentifier());
                    if (no_ping) {
                        setActionFlag(reg, slow_responding_flag);
                    }
                    if (useJsonSerialization) {
                        setActionFlag(reg, use_json_serialization_flag);
                    }
                    if (!brokerKey.empty() && brokerKey != universalKey) {
                        reg.setStringData(getAddress(), brokerKey);
                    } else {
                        reg.setStringData(getAddress());
                    }
                    transmit(parent_route_id, reg);
                }
                LOG_SUMMARY(parent_broker_id,
                            getIdentifier(),
                            fmt::format("Broker {} connected on {}",
                                        getIdentifier(),
                                        getAddress()));
                if (!configString.empty()) {
                    makeConnections(configString);
                }
            } else {
                setBrokerState(BrokerState::CONFIGURED);
            }
            return res;
        }
        if (getBrokerState() == BrokerState::CONNECTING) {
            while (getBrokerState() == BrokerState::CONNECTING) {
                std::this_thread::sleep_for(std::chrono::milliseconds(20));
            }
        }
    }
    return isConnected();
}